

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

Supp_One_t * Supp_ManMergeEntry(Supp_Man_t *pMan,Supp_One_t *p1,Supp_One_t *p2,int nRefs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Supp_One_t *pSVar4;
  int iVar5;
  ulong uVar6;
  Supp_One_t *pSVar7;
  Supp_One_t *pSVar8;
  
  pSVar4 = Supp_ManFetchEntry(pMan,p2->nOuts + p1->nOuts,nRefs);
  pSVar8 = p1 + 1;
  pSVar7 = p2 + 1;
  iVar5 = p1->nOuts;
  iVar1 = p2->nOuts;
  uVar6 = 0;
  while ((pSVar8 < (Supp_One_t *)(&p1[1].nRefs + iVar5) &&
         (pSVar7 < (Supp_One_t *)(&p2[1].nRefs + iVar1)))) {
    iVar2 = pSVar8->nRefs;
    iVar3 = pSVar7->nRefs;
    if (iVar2 == iVar3) {
      pSVar8 = (Supp_One_t *)&pSVar8->nOuts;
      *(int *)((long)&pSVar4[1].nRefs + uVar6) = iVar2;
      pSVar7 = (Supp_One_t *)&pSVar7->nOuts;
    }
    else if (iVar2 < iVar3) {
      pSVar8 = (Supp_One_t *)&pSVar8->nOuts;
      *(int *)((long)&pSVar4[1].nRefs + uVar6) = iVar2;
    }
    else {
      pSVar7 = (Supp_One_t *)&pSVar7->nOuts;
      *(int *)((long)&pSVar4[1].nRefs + uVar6) = iVar3;
    }
    uVar6 = uVar6 + 4;
  }
  for (; pSVar8 < (Supp_One_t *)(&p1[1].nRefs + iVar5); pSVar8 = (Supp_One_t *)&pSVar8->nOuts) {
    *(int *)((long)&pSVar4[1].nRefs + uVar6) = pSVar8->nRefs;
    uVar6 = uVar6 + 4;
  }
  for (; pSVar7 < (Supp_One_t *)(&p2[1].nRefs + iVar1); pSVar7 = (Supp_One_t *)&pSVar7->nOuts) {
    *(int *)((long)&pSVar4[1].nRefs + uVar6) = pSVar7->nRefs;
    uVar6 = uVar6 + 4;
  }
  iVar5 = (int)(uVar6 >> 2);
  pSVar4->nOuts = iVar5;
  if (pSVar4->nOutsAlloc < iVar5) {
    __assert_fail("p->nOuts <= p->nOutsAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcPart.c"
                  ,0xea,
                  "Supp_One_t *Supp_ManMergeEntry(Supp_Man_t *, Supp_One_t *, Supp_One_t *, int)");
  }
  if (iVar5 < p1->nOuts) {
    __assert_fail("p->nOuts >= p1->nOuts",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcPart.c"
                  ,0xeb,
                  "Supp_One_t *Supp_ManMergeEntry(Supp_Man_t *, Supp_One_t *, Supp_One_t *, int)");
  }
  if (iVar5 < p2->nOuts) {
    __assert_fail("p->nOuts >= p2->nOuts",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcPart.c"
                  ,0xec,
                  "Supp_One_t *Supp_ManMergeEntry(Supp_Man_t *, Supp_One_t *, Supp_One_t *, int)");
  }
  return pSVar4;
}

Assistant:

Supp_One_t * Supp_ManMergeEntry( Supp_Man_t * pMan, Supp_One_t * p1, Supp_One_t * p2, int nRefs )
{
    Supp_One_t * p = Supp_ManFetchEntry( pMan, p1->nOuts + p2->nOuts, nRefs );
    int * pBeg1 = p1->pOuts;
    int * pBeg2 = p2->pOuts;
    int * pBeg  = p->pOuts;
    int * pEnd1 = p1->pOuts + p1->nOuts;
    int * pEnd2 = p2->pOuts + p2->nOuts;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    p->nOuts = pBeg - p->pOuts;
    assert( p->nOuts <= p->nOutsAlloc );
    assert( p->nOuts >= p1->nOuts );
    assert( p->nOuts >= p2->nOuts );
    return p;
}